

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void getFileNames(string *path,
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *files)

{
  DIR *__dirp;
  dirent *pdVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string filename;
  
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar1 = readdir(__dirp);
      if (pdVar1 == (dirent *)0x0) break;
      if ((pdVar1->d_name[0] != '.') ||
         ((pdVar1->d_name[1] != '\0' && ((pdVar1->d_name[1] != '.' || (pdVar1->d_name[2] != '\0'))))
         )) {
        std::__cxx11::string::string((string *)&filename,pdVar1->d_name,(allocator *)&local_70);
        std::operator+(&local_90,path,"/");
        std::operator+(&local_70,&local_90,&filename);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                   &local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&filename);
      }
    }
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Folder doesn\'t Exist!");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

void getFileNames(std::string path, std::vector<std::string>& files)
{
	DIR* pDir;
	struct dirent* ptr;
	if (!(pDir = opendir(path.c_str()))) {
		std::cout << "Folder doesn't Exist!" << std::endl;
		exit(-1);
	}
	while ((ptr = readdir(pDir)) != 0) {
		if (strcmp(ptr->d_name, ".") != 0 && strcmp(ptr->d_name, "..") != 0) {
			std::string filename(ptr->d_name);
			files.push_back(path + "/" + filename);
		}
	}
}